

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::DeepScanLineInputFile::Data::~Data(Data *this)

{
  size_type *psVar1;
  LineBuffer *pLVar2;
  char *pcVar3;
  bool *pbVar4;
  uint *puVar5;
  pointer puVar6;
  pointer ppLVar7;
  pointer ppIVar8;
  pointer ppLVar9;
  ulong uVar10;
  
  ppLVar7 = (this->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar9 = (this->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar9 != ppLVar7) {
    uVar10 = 0;
    do {
      pLVar2 = ppLVar7[uVar10];
      if (pLVar2 != (LineBuffer *)0x0) {
        if (*(long **)&pLVar2->minY != (long *)0x0) {
          (**(code **)(**(long **)&pLVar2->minY + 8))();
        }
        IlmThread_2_5::Semaphore::~Semaphore((Semaphore *)((long)&(pLVar2->exception).field_2 + 8));
        psVar1 = &(pLVar2->exception)._M_string_length;
        if ((size_type *)*(undefined1 **)&pLVar2->partiallyFull != psVar1) {
          operator_delete(*(undefined1 **)&pLVar2->partiallyFull,*psVar1 + 1);
        }
        operator_delete(pLVar2,0x88);
        ppLVar7 = (this->lineBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppLVar9 = (this->lineBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)ppLVar9 - (long)ppLVar7 >> 3));
  }
  ppIVar8 = (this->slices).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppIVar8) {
    uVar10 = 0;
    do {
      operator_delete(ppIVar8[uVar10],0x48);
      uVar10 = uVar10 + 1;
      ppIVar8 = (this->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->slices).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar8 >> 3)
            );
  }
  if (this->sampleCountTableComp != (Compressor *)0x0) {
    (*this->sampleCountTableComp->_vptr_Compressor[1])();
  }
  if ((this->multiPartBackwardSupport == true) && (this->multiPartFile != (MultiPartInputFile *)0x0)
     ) {
    (*(this->multiPartFile->super_GenericInputFile)._vptr_GenericInputFile[1])();
  }
  pcVar3 = (this->sampleCountTableBuffer)._data;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  pbVar4 = (this->gotSampleCount)._data;
  if (pbVar4 != (bool *)0x0) {
    operator_delete__(pbVar4);
  }
  puVar5 = (this->lineSampleCount)._data;
  if (puVar5 != (uint *)0x0) {
    operator_delete__(puVar5);
  }
  puVar5 = (this->sampleCount)._data;
  if (puVar5 != (uint *)0x0) {
    operator_delete__(puVar5);
  }
  ppLVar7 = (this->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppLVar7 != (pointer)0x0) {
    operator_delete(ppLVar7,(long)(this->lineBuffers).
                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar7
                   );
  }
  ppIVar8 = (this->slices).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar8 != (pointer)0x0) {
    operator_delete(ppIVar8,(long)(this->slices).
                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar8
                   );
  }
  puVar6 = (this->offsetInLineBuffer).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)(this->offsetInLineBuffer).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6);
  }
  puVar6 = (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)(this->bytesPerLine).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6);
  }
  puVar6 = (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)(this->lineOffsets).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6);
  }
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepScanLineInputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size(); i++)
        if (lineBuffers[i] != 0)
            delete lineBuffers[i];

    for (size_t i = 0; i < slices.size(); i++)
        delete slices[i];

    if (sampleCountTableComp != 0)
        delete sampleCountTableComp;
    
    if (multiPartBackwardSupport)
        delete multiPartFile;
}